

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infoPageAnalyzer_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [40];
  infoPageAnalyzer infoAna;
  ifstream fin;
  allocator local_39;
  string local_38 [8];
  string inputPage;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::ifstream::ifstream
            (&infoAna.super_pageAnalyzer.pageContent.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"./testInfo.html",_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      cVar2 = std::istream::get();
      std::__cxx11::string::operator+=(local_38,cVar2);
    }
  }
  std::ifstream::close();
  infoPageAnalyzer::infoPageAnalyzer((infoPageAnalyzer *)(local_2b0 + 0x20),(string *)local_38);
  infoPageAnalyzer::getComicOriginalName_abi_cxx11_((infoPageAnalyzer *)local_2b0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_2b0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_2b0);
  infoPageAnalyzer::getComicTranslatedName_abi_cxx11_((infoPageAnalyzer *)local_2d0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_2d0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_2d0);
  infoPageAnalyzer::getFirstPicPageURL_abi_cxx11_((infoPageAnalyzer *)local_2f0);
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_2f0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_2f0);
  iVar3 = infoPageAnalyzer::getTotalPageNumber((infoPageAnalyzer *)(local_2b0 + 0x20));
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  infoPageAnalyzer::~infoPageAnalyzer((infoPageAnalyzer *)(local_2b0 + 0x20));
  std::ifstream::~ifstream
            (&infoAna.super_pageAnalyzer.pageContent.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    std::string inputPage = std::string("");

    std::ifstream fin("./testInfo.html", std::ios::in);
    if(fin.is_open())
    {
        while (!fin.eof())
            inputPage += (char)fin.get();
    }
    fin.close();

    infoPageAnalyzer infoAna = infoPageAnalyzer(inputPage);
    std::cout << infoAna.getComicOriginalName() << std::endl;
    std::cout << infoAna.getComicTranslatedName() << std::endl;
    std::cout << infoAna.getFirstPicPageURL() << std::endl;
    std::cout << infoAna.getTotalPageNumber() << std::endl;

    return 0;
}